

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O3

ServiceOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (ServiceOptions *__return_storage_ptr__,ServiceDescriptor *descriptor)

{
  ServiceOptions options;
  ServiceOptions local_70;
  
  ServiceOptions::ServiceOptions(&local_70,(Arena *)0x0,descriptor->options_);
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&local_70.super_Message,descriptor->file_->pool_,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0);
  ServiceOptions::ServiceOptions(__return_storage_ptr__,(Arena *)0x0,&local_70);
  ServiceOptions::~ServiceOptions(&local_70);
  return __return_storage_ptr__;
}

Assistant:

ServiceOptions StripLocalSourceRetentionOptions(
    const ServiceDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}